

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::GenerateMemberConstructor
          (SingularStringView *this,Printer *p)

{
  char *pcVar1;
  undefined8 uStack_8;
  
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    pcVar1 = "$name$_{}";
    uStack_8 = 9;
  }
  else if (((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_
           == (string *)0x0) {
    pcVar1 = "$name$_(arena)";
    uStack_8 = 0xe;
  }
  else if (this->opts_->experimental_use_micro_string == true) {
    pcVar1 = "$name$_($default_variable_field$)";
    uStack_8 = 0x21;
  }
  else {
    pcVar1 = "$name$_(arena, $default_variable_field$)";
    uStack_8 = 0x28;
  }
  io::Printer::Emit(p,uStack_8,pcVar1);
  return;
}

Assistant:

void GenerateMemberConstructor(io::Printer* p) const override {
    if (is_inlined()) {
      p->Emit("$name$_{}");
    } else if (EmptyDefault()) {
      p->Emit("$name$_(arena)");
    } else if (use_micro_string()) {
      p->Emit("$name$_($default_variable_field$)");
    } else {
      p->Emit("$name$_(arena, $default_variable_field$)");
    }
  }